

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void gauden_free_acc(gauden_t *g)

{
  vector_t ***ppppfVar1;
  vector_t ****inptr;
  
  ppppfVar1 = g->macc;
  if (ppppfVar1 != (vector_t ***)0x0) {
    ckd_free(***ppppfVar1);
    ckd_free_3d(ppppfVar1);
  }
  g->macc = (vector_t ***)0x0;
  ppppfVar1 = g->vacc;
  if (ppppfVar1 != (vector_t ***)0x0) {
    ckd_free(***ppppfVar1);
    ckd_free_3d(ppppfVar1);
  }
  g->vacc = (vector_t ***)0x0;
  inptr = g->fullvacc;
  if (inptr != (vector_t ****)0x0) {
    ckd_free(****inptr);
    ckd_free_4d(inptr);
  }
  g->fullvacc = (vector_t ****)0x0;
  if (g->dnom != (float32 ***)0x0) {
    ckd_free_3d(g->dnom);
  }
  g->dnom = (float32 ***)0x0;
  return;
}

Assistant:

void
gauden_free_acc(gauden_t *g)
{
    if (g->macc) {
	gauden_free_param(g->macc);
    }
    g->macc = NULL;

    if (g->vacc) {
	gauden_free_param(g->vacc);
    }
    g->vacc = NULL;

    if (g->fullvacc) {
	gauden_free_param_full(g->fullvacc);
    }
    g->fullvacc = NULL;

    if (g->dnom) {
	ckd_free_3d((void ***)g->dnom);
    }
    g->dnom = NULL;
}